

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

void __thiscall cp::PlanFootprints::calcNextWaistPose(PlanFootprints *this)

{
  QuaternionBase<Eigen::Quaternion<double,0>> *this_00;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *this_01;
  Scalar *pSVar1;
  ReturnType local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_88;
  undefined1 local_70 [8];
  Vector3 waist_pos;
  undefined1 local_38 [8];
  Quat waist_r;
  PlanFootprints *this_local;
  
  this_00 = (QuaternionBase<Eigen::Quaternion<double,0>> *)Pose::q((Pose *)(this + 0x1d0));
  rpy2q((Quat *)(waist_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2),0.0,0.0,*(double *)(this + 0x300));
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)local_38,this_00,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (waist_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2));
  this_01 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)Pose::p((Pose *)(this + 0x1d0));
  Eigen::RotationBase<Eigen::Quaternion<double,0>,3>::operator*
            (&local_a0,(RotationBase<Eigen::Quaternion<double,0>,3> *)local_38,
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(this + 0x2e8));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_88,this_01,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,3,1,0,3,1> *)local_70,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_88);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_70);
  *pSVar1 = 0.0;
  Pose::set((Pose *)(this + 0x1d0),(Vector3 *)local_70,(Quat *)local_38);
  return;
}

Assistant:

void PlanFootprints::calcNextWaistPose() {
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);
}